

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrontLoadedReporterFactory.cpp
# Opt level: O1

shared_ptr<ApprovalTests::Reporter> *
ApprovalTests::FrontLoadedReporterFactory::frontLoadedReporter(void)

{
  int iVar1;
  undefined1 local_19;
  DefaultFrontLoadedReporter *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  if (frontLoadedReporter()::reporter == '\0') {
    iVar1 = __cxa_guard_acquire(&frontLoadedReporter()::reporter);
    if (iVar1 != 0) {
      local_18 = (DefaultFrontLoadedReporter *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ApprovalTests::DefaultFrontLoadedReporter,std::allocator<ApprovalTests::DefaultFrontLoadedReporter>>
                (&_Stack_10,&local_18,
                 (allocator<ApprovalTests::DefaultFrontLoadedReporter> *)&local_19);
      frontLoadedReporter::reporter.
      super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_10._M_pi;
      frontLoadedReporter::reporter.
      super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_18;
      __cxa_atexit(::std::__shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&frontLoadedReporter::reporter,&__dso_handle);
      __cxa_guard_release(&frontLoadedReporter()::reporter);
    }
  }
  return &frontLoadedReporter::reporter;
}

Assistant:

std::shared_ptr<Reporter>& FrontLoadedReporterFactory::frontLoadedReporter()
    {
        static std::shared_ptr<Reporter> reporter =
            std::make_shared<DefaultFrontLoadedReporter>();
        return reporter;
    }